

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int ecjpake_hash(mbedtls_md_type_t md_type,mbedtls_ecp_group *grp,int pf,mbedtls_ecp_point *G,
                mbedtls_ecp_point *V,mbedtls_ecp_point *X,char *id,mbedtls_mpi *h)

{
  byte bVar1;
  int iVar2;
  uchar *end_00;
  size_t __n;
  uint uVar3;
  uchar local_158 [8];
  uchar hash [32];
  size_t id_len;
  uchar *end;
  uchar *p;
  uchar buf [217];
  int ret;
  mbedtls_ecp_point *X_local;
  mbedtls_ecp_point *V_local;
  mbedtls_ecp_point *G_local;
  int pf_local;
  mbedtls_ecp_group *grp_local;
  mbedtls_md_type_t md_type_local;
  
  buf[0xd4] = 0x92;
  buf[0xd5] = 0xff;
  buf[0xd6] = 0xff;
  buf[0xd7] = 0xff;
  end = (uchar *)&p;
  end_00 = buf + 0xd1;
  unique0x1000014c = X;
  __n = strlen(id);
  buf._212_4_ = ecjpake_write_len_point(&end,end_00,grp,pf,G);
  if (((buf._212_4_ == 0) &&
      (buf._212_4_ = ecjpake_write_len_point(&end,end_00,grp,pf,V), buf._212_4_ == 0)) &&
     (buf._212_4_ = ecjpake_write_len_point(&end,end_00,grp,pf,stack0xffffffffffffffc8),
     buf._212_4_ == 0)) {
    if ((long)end_00 - (long)end < 4) {
      return -0x4f00;
    }
    uVar3 = (uint)__n;
    mbedtls_put_unaligned_uint32
              (end,uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18);
    end = end + 4;
    if ((end_00 < end) || ((ulong)((long)end_00 - (long)end) < __n)) {
      return -0x4f00;
    }
    memcpy(end,id,__n);
    end = end + __n;
    buf._212_4_ = mbedtls_ecjpake_compute_hash(md_type,(uchar *)&p,(long)end - (long)&p,local_158);
    if (buf._212_4_ == 0) {
      bVar1 = mbedtls_md_get_size_from_type(md_type);
      buf._212_4_ = mbedtls_mpi_read_binary(h,local_158,(ulong)bVar1);
      if (buf._212_4_ == 0) {
        buf._212_4_ = mbedtls_mpi_mod_mpi(h,h,&grp->N);
      }
    }
  }
  iVar2._0_1_ = buf[0xd4];
  iVar2._1_1_ = buf[0xd5];
  iVar2._2_1_ = buf[0xd6];
  iVar2._3_1_ = buf[0xd7];
  return iVar2;
}

Assistant:

static int ecjpake_hash(const mbedtls_md_type_t md_type,
                        const mbedtls_ecp_group *grp,
                        const int pf,
                        const mbedtls_ecp_point *G,
                        const mbedtls_ecp_point *V,
                        const mbedtls_ecp_point *X,
                        const char *id,
                        mbedtls_mpi *h)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char buf[ECJPAKE_HASH_BUF_LEN];
    unsigned char *p = buf;
    const unsigned char *end = buf + sizeof(buf);
    const size_t id_len = strlen(id);
    unsigned char hash[MBEDTLS_MD_MAX_SIZE];

    /* Write things to temporary buffer */
    MBEDTLS_MPI_CHK(ecjpake_write_len_point(&p, end, grp, pf, G));
    MBEDTLS_MPI_CHK(ecjpake_write_len_point(&p, end, grp, pf, V));
    MBEDTLS_MPI_CHK(ecjpake_write_len_point(&p, end, grp, pf, X));

    if (end - p < 4) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    MBEDTLS_PUT_UINT32_BE(id_len, p, 0);
    p += 4;

    if (end < p || (size_t) (end - p) < id_len) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    memcpy(p, id, id_len);
    p += id_len;

    /* Compute hash */
    MBEDTLS_MPI_CHK(mbedtls_ecjpake_compute_hash(md_type,
                                                 buf, p - buf, hash));

    /* Turn it into an integer mod n */
    MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(h, hash,
                                            mbedtls_md_get_size_from_type(md_type)));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(h, h, &grp->N));

cleanup:
    return ret;
}